

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

void __thiscall
QFontDatabasePrivate::addApplicationFallbackFontFamily
          (QFontDatabasePrivate *this,ExtendedScript script,QString *familyName)

{
  Span *pSVar1;
  QFontCache *this_00;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  ExtendedScript copy;
  QArrayDataPointer<QString> local_58;
  ExtendedScript local_40;
  ExtendedScript local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = script;
  pVar3 = (piter)QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::
                 findImpl<QFontDatabasePrivate::ExtendedScript>
                           (&this->applicationFallbackFontFamiliesHash,&local_40);
  if (pVar3.d ==
      (Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *)0x0 &&
      pVar3.bucket == 0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    local_3c = local_40;
    pVar3 = (piter)QHash<QFontDatabasePrivate::ExtendedScript,QList<QString>>::
                   emplace<QList<QString>const&>
                             ((QHash<QFontDatabasePrivate::ExtendedScript,QList<QString>> *)
                              &this->applicationFallbackFontFamiliesHash,&local_3c,
                              (QList<QString> *)&local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  pSVar1 = (pVar3.d)->spans;
  uVar2 = pVar3.bucket >> 7;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)
             (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)pVar3.bucket & 0x7f]].storage.data +
             8),0,familyName);
  this_00 = QFontCache::instance();
  QFontCache::clear(this_00);
  QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::clear
            (&(this->fallbacksCache).d);
  (this->fallbacksCache).total = 0;
  (this->fallbacksCache).chain.next = &(this->fallbacksCache).chain;
  (this->fallbacksCache).chain.prev = &(this->fallbacksCache).chain;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDatabasePrivate::addApplicationFallbackFontFamily(ExtendedScript script, const QString &familyName)
{
    auto it = applicationFallbackFontFamiliesHash.find(script);
    if (it == applicationFallbackFontFamiliesHash.end())
        it = applicationFallbackFontFamiliesHash.insert(script, QStringList{});

    it->prepend(familyName);

    QFontCache::instance()->clear();
    fallbacksCache.clear();
}